

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1ba5289::MultisigDescriptor::MakeScripts
          (MultisigDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> param_3,FlatSigningProvider *param_4)

{
  iterator iVar1;
  long in_RSI;
  CPubKey *in_RDI;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_R9;
  long in_FS_OFFSET;
  vector<CPubKey,_std::allocator<CPubKey>_> sorted_keys;
  CScript *in_stack_ffffffffffffff18;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff20;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff28;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> __last;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> __first;
  CScript *in_stack_ffffffffffffff58;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff60;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_ffffffffffffff68;
  int nRequired;
  CPubKey local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RSI + 0x5c) & 1) == 0) {
    GetScriptForMultisig((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),in_stack_ffffffffffffff60);
    Vector<CScript>(in_stack_ffffffffffffff58);
    CScript::~CScript(in_stack_ffffffffffffff18);
  }
  else {
    __last._M_current = &local_60;
    __first._M_current = in_RDI;
    std::vector<CPubKey,_std::allocator<CPubKey>_>::vector(in_R9,in_stack_ffffffffffffff68);
    iVar1 = std::vector<CPubKey,_std::allocator<CPubKey>_>::begin(in_stack_ffffffffffffff20);
    nRequired = (int)((ulong)iVar1._M_current >> 0x20);
    iVar1 = std::vector<CPubKey,_std::allocator<CPubKey>_>::end(in_stack_ffffffffffffff20);
    std::sort<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>>
              (__first,__last);
    GetScriptForMultisig(nRequired,(vector<CPubKey,_std::allocator<CPubKey>_> *)iVar1._M_current);
    Vector<CScript>(in_stack_ffffffffffffff58);
    CScript::~CScript(in_stack_ffffffffffffff18);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector(in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (vector<CScript,_std::allocator<CScript>_> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider&) const override {
        if (m_sorted) {
            std::vector<CPubKey> sorted_keys(keys);
            std::sort(sorted_keys.begin(), sorted_keys.end());
            return Vector(GetScriptForMultisig(m_threshold, sorted_keys));
        }
        return Vector(GetScriptForMultisig(m_threshold, keys));
    }